

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O1

void Ifn_NtkAddConstraints(Ifn_Ntk_t *p,sat_solver *pSat)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  Vec_Int_t *vMemory;
  uint uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  word uTruth;
  int pVars [11];
  word pTruth [4];
  ulong local_b0;
  int local_a8 [24];
  word local_48 [4];
  
  vMemory = (Vec_Int_t *)malloc(0x10);
  vMemory->nCap = 0;
  vMemory->nSize = 0;
  vMemory->pArray = (int *)0x0;
  if (0x40 < (uint)p->nVars) {
    __assert_fail("nBits >= 0 && nBits <= 64",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                  ,0xc2,"word Abc_Tt6Mask(int)");
  }
  uVar7 = p->nParsVNum;
  if ((int)uVar7 < 0) {
    __assert_fail("nVars >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                  ,0x30d,"word Abc_Tt6Stretch(word, int)");
  }
  uVar3 = 1;
  if (1 < uVar7) {
    uVar3 = uVar7;
  }
  uVar11 = 2;
  if (1 < uVar7) {
    uVar11 = uVar3;
  }
  uVar3 = 3;
  if (uVar11 != 2) {
    uVar3 = uVar11;
  }
  uVar6 = 4;
  if (uVar3 != 3) {
    uVar6 = uVar3;
  }
  uVar4 = 5;
  if (uVar6 != 4) {
    uVar4 = uVar6;
  }
  if (1 < uVar4 - 5) {
    __assert_fail("nVars == 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                  ,0x31a,"word Abc_Tt6Stretch(word, int)");
  }
  uVar12 = ~(0xffffffffffffffffU >> (-(char)p->nVars & 0x3fU));
  uVar13 = 0;
  if (uVar7 != 0) {
    uVar13 = (ulong)((uint)uVar12 & 2) * 5;
  }
  if (1 < uVar7) {
    uVar13 = uVar12;
  }
  uVar10 = (uint)uVar13 & 0xe;
  uVar12 = (ulong)(uVar10 << 4 | uVar10);
  if (uVar11 != 2) {
    uVar12 = uVar13;
  }
  uVar11 = (uint)uVar12 & 0xfe;
  uVar13 = (ulong)(uVar11 << 8 | uVar11);
  if (uVar3 != 3) {
    uVar13 = uVar12;
  }
  uVar12 = (ulong)(uint)((int)uVar13 << 0x10) | uVar13 & 0xffff;
  if (uVar6 != 4) {
    uVar12 = uVar13;
  }
  local_b0 = uVar12 << 0x20 | uVar12 & 0xffffffff;
  if (uVar4 != 5) {
    local_b0 = uVar12;
  }
  if ((int)uVar7 < 5) {
    if (local_b0 != 0) {
      iVar5 = Kit_TruthIsop((uint *)&local_b0,uVar7,vMemory,0);
      if (iVar5 != 0) {
        __assert_fail("RetValue == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                      ,0x427,"void Ifn_NtkAddConstraints(Ifn_Ntk_t *, sat_solver *)");
      }
      if (0 < p->nInps) {
        iVar5 = 0;
        do {
          iVar1 = p->nParsVNum;
          if (0 < (long)iVar1) {
            iVar2 = p->nParsVIni;
            lVar8 = 0;
            do {
              local_a8[lVar8] = iVar1 * iVar5 + iVar2 + (int)lVar8;
              lVar8 = lVar8 + 1;
            } while (iVar1 != lVar8);
          }
          Ifn_NtkAddConstrOne(pSat,vMemory,local_a8,iVar1);
          iVar5 = iVar5 + 1;
        } while (iVar5 < p->nInps);
      }
    }
    if (p->nConstr != 0) {
      uVar7 = (uint)(p->nVars == p->nInps);
      Ifn_TtComparisonConstr(local_48,p->nParsVNum,uVar7,uVar7);
      iVar5 = Kit_TruthIsop((uint *)local_48,p->nParsVNum * 2,vMemory,0);
      if (iVar5 != 0) {
        __assert_fail("RetValue == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                      ,0x439,"void Ifn_NtkAddConstraints(Ifn_Ntk_t *, sat_solver *)");
      }
      if (0 < p->nConstr) {
        lVar8 = 0;
        do {
          iVar5 = p->nParsVNum;
          if (0 < (long)iVar5) {
            uVar7 = p->pConstr[lVar8];
            iVar1 = p->nParsVIni;
            lVar9 = 0;
            do {
              *(int *)(local_48 + lVar9 + -0xc) = ((int)uVar7 >> 0x10) * iVar5 + iVar1 + (int)lVar9;
              *(uint *)((long)local_48 + lVar9 * 8 + -0x5c) =
                   (uVar7 & 0xffff) * iVar5 + iVar1 + (int)lVar9;
              lVar9 = lVar9 + 1;
            } while (iVar5 != lVar9);
          }
          Ifn_NtkAddConstrOne(pSat,vMemory,local_a8,iVar5 * 2);
          lVar8 = lVar8 + 1;
        } while (lVar8 < p->nConstr);
      }
    }
    if (vMemory->pArray != (int *)0x0) {
      free(vMemory->pArray);
      vMemory->pArray = (int *)0x0;
    }
    free(vMemory);
    return;
  }
  __assert_fail("p->nParsVNum <= 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                ,0x422,"void Ifn_NtkAddConstraints(Ifn_Ntk_t *, sat_solver *)");
}

Assistant:

void Ifn_NtkAddConstraints( Ifn_Ntk_t * p, sat_solver * pSat )
{
    int fAddConstr = 1;
    Vec_Int_t * vCover = Vec_IntAlloc( 0 );
    word uTruth = Abc_Tt6Stretch( ~Abc_Tt6Mask(p->nVars), p->nParsVNum );
    assert( p->nParsVNum <= 4 );
    if ( uTruth )
    {
        int i, k, pVars[IFN_INS];
        int RetValue = Kit_TruthIsop( (unsigned *)&uTruth, p->nParsVNum, vCover, 0 );
        assert( RetValue == 0 );
//        Dau_DsdPrintFromTruth( &uTruth, p->nParsVNum );
        // add capacity constraints
        for ( i = 0; i < p->nInps; i++ )
        {
            for ( k = 0; k < p->nParsVNum; k++ )
                pVars[k] = p->nParsVIni + i * p->nParsVNum + k;
            Ifn_NtkAddConstrOne( pSat, vCover, pVars, p->nParsVNum );
        }
    }
    // ordering constraints
    if ( fAddConstr && p->nConstr )
    {
        word pTruth[4];
        int i, k, RetValue, pVars[2*IFN_INS];
        int fForceDiff = (p->nVars == p->nInps);
        Ifn_TtComparisonConstr( pTruth, p->nParsVNum, fForceDiff, fForceDiff );
        RetValue = Kit_TruthIsop( (unsigned *)pTruth, 2*p->nParsVNum, vCover, 0 );
        assert( RetValue == 0 );
//        Kit_TruthIsopPrintCover( vCover, 2*p->nParsVNum, 0 );
        for ( i = 0; i < p->nConstr; i++ )
        {
            int iVar1 = p->pConstr[i] >> 16;
            int iVar2 = p->pConstr[i] & 0xFFFF;
            for ( k = 0; k < p->nParsVNum; k++ )
            {
                pVars[2*k+0] = p->nParsVIni + iVar1 * p->nParsVNum + k;
                pVars[2*k+1] = p->nParsVIni + iVar2 * p->nParsVNum + k;
            }
            Ifn_NtkAddConstrOne( pSat, vCover, pVars, 2*p->nParsVNum );
//            printf( "added constraint with %d clauses for %d and %d\n", Vec_IntSize(vCover), iVar1, iVar2 );
        }
    }
    Vec_IntFree( vCover );
}